

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsCliqueTable.cpp
# Opt level: O1

void __thiscall HighsCliqueTable::cleanupFixed(HighsCliqueTable *this,HighsDomain *globaldom)

{
  double *pdVar1;
  double dVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  
  iVar3 = this->nfixings;
  uVar4 = (ulong)((long)(globaldom->col_upper_).super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                 (long)(globaldom->col_upper_).super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_start) >> 3;
  if ((int)uVar4 != 0) {
    uVar5 = 0;
    do {
      if ((this->colDeleted).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start[uVar5] == '\0') {
        dVar2 = (globaldom->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[uVar5];
        pdVar1 = (globaldom->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl
                 .super__Vector_impl_data._M_start + uVar5;
        if ((((dVar2 == *pdVar1) && (!NAN(dVar2) && !NAN(*pdVar1))) &&
            (((dVar2 == 1.0 && (!NAN(dVar2))) || ((dVar2 == 0.0 && (!NAN(dVar2))))))) &&
           (vertexInfeasible(this,globaldom,(HighsInt)uVar5,~(int)dVar2 & 1),
           globaldom->infeasible_ != false)) {
          return;
        }
      }
      uVar5 = uVar5 + 1;
    } while ((uVar4 & 0xffffffff) != uVar5);
  }
  if (this->nfixings == iVar3) {
    return;
  }
  propagateAndCleanup(this,globaldom);
  return;
}

Assistant:

void HighsCliqueTable::cleanupFixed(HighsDomain& globaldom) {
  HighsInt numcol = globaldom.col_upper_.size();
  HighsInt oldnfixings = nfixings;
  for (HighsInt i = 0; i != numcol; ++i) {
    if (colDeleted[i] || globaldom.col_lower_[i] != globaldom.col_upper_[i])
      continue;
    if (globaldom.col_lower_[i] != 1.0 && globaldom.col_lower_[i] != 0.0)
      continue;

    HighsInt fixval = (HighsInt)globaldom.col_lower_[i];
    CliqueVar v(i, 1 - fixval);

    vertexInfeasible(globaldom, v.col, v.val);
    if (globaldom.infeasible()) return;
  }

  if (nfixings != oldnfixings) propagateAndCleanup(globaldom);
}